

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O3

void * utf8ncpy(void *dst,void *src,size_t n)

{
  size_t sVar1;
  char cVar2;
  
  cVar2 = *src;
  sVar1 = 0;
  do {
    *(char *)((long)dst + sVar1) = cVar2;
    cVar2 = *(char *)((long)src + sVar1 + 1);
    if (cVar2 == '\0') {
      if (n - sVar1 == 0) {
        return dst;
      }
      memset((void *)((long)dst + sVar1 + 1),0,n - sVar1);
      return dst;
    }
    sVar1 = sVar1 + 1;
  } while (n != sVar1);
  return dst;
}

Assistant:

void *utf8ncpy(void *dst, const void *src, size_t n) {
  char *d = (char *)dst;
  const char *s = (const char *)src;

  // overwriting anything previously in dst, write byte-by-byte
  // from src
  do {
    *d++ = *s++;
  } while (('\0' != *s) && (0 != --n));

  // append null terminating byte
  while (0 != n) {
    *d++ = '\0';
    n--;
  }

  return dst;
}